

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void xmlXPathAddValues(xmlXPathParserContextPtr ctxt)

{
  xmlXPathObjectPtr *ppxVar1;
  uint uVar2;
  xmlXPathObjectPtr pxVar3;
  int iVar4;
  double dVar5;
  
  if (ctxt != (xmlXPathParserContextPtr)0x0) {
    iVar4 = ctxt->valueNr;
    if (0 < (long)iVar4) {
      uVar2 = iVar4 - 1;
      ctxt->valueNr = uVar2;
      ppxVar1 = ctxt->valueTab;
      if (iVar4 == 1) {
        pxVar3 = (xmlXPathObjectPtr)0x0;
      }
      else {
        pxVar3 = ppxVar1[(long)iVar4 + -2];
      }
      ctxt->value = pxVar3;
      pxVar3 = ppxVar1[uVar2];
      ppxVar1[uVar2] = (xmlXPathObjectPtr)0x0;
      if (pxVar3 != (xmlXPathObjectPtr)0x0) {
        dVar5 = xmlXPathCastToNumberInternal(ctxt,pxVar3);
        xmlXPathReleaseObject(ctxt->context,pxVar3);
        pxVar3 = ctxt->value;
        if (pxVar3 != (xmlXPathObjectPtr)0x0) {
          if (pxVar3->type == XPATH_NUMBER) {
LAB_001bdbcd:
            pxVar3->floatval = dVar5 + pxVar3->floatval;
            return;
          }
          xmlXPathNumberFunction(ctxt,1);
          pxVar3 = ctxt->value;
          if ((pxVar3 != (xmlXPathObjectPtr)0x0) && (pxVar3->type == XPATH_NUMBER))
          goto LAB_001bdbcd;
        }
        iVar4 = 0xb;
        goto LAB_001bdbec;
      }
    }
  }
  iVar4 = 10;
LAB_001bdbec:
  xmlXPathErr(ctxt,iVar4);
  return;
}

Assistant:

void
xmlXPathAddValues(xmlXPathParserContextPtr ctxt) {
    xmlXPathObjectPtr arg;
    double val;

    arg = xmlXPathValuePop(ctxt);
    if (arg == NULL)
	XP_ERROR(XPATH_INVALID_OPERAND);
    val = xmlXPathCastToNumberInternal(ctxt, arg);
    xmlXPathReleaseObject(ctxt->context, arg);
    CAST_TO_NUMBER;
    CHECK_TYPE(XPATH_NUMBER);
    ctxt->value->floatval += val;
}